

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O3

int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int nVars;
  uint uVar8;
  long lVar9;
  uint *pRes;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char pVars [16];
  byte abStack_48 [24];
  
  if (pIsfL->uSupp != 0) {
    __assert_fail("pIsfL->uSupp == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                  ,0xd5,
                  "int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                 );
  }
  if (pIsfR->uSupp == 0) {
    uVar3 = p->nVars;
    if (0 < (int)uVar3) {
      uVar4 = pIsf->uSupp;
      uVar8 = 0;
      uVar10 = 0;
      do {
        if ((uVar4 >> (uVar10 & 0x1f) & 1) != 0) {
          lVar9 = (long)(int)uVar8;
          uVar8 = uVar8 + 1;
          abStack_48[lVar9] = (byte)uVar10;
        }
        uVar10 = uVar10 + 1;
      } while (uVar3 != uVar10);
      if (0 < (int)uVar8) {
        uVar12 = 0;
        do {
          bVar1 = abStack_48[uVar12];
          Kit_TruthExistNew(p->puTemp1,pIsf->puOff,p->nVars,(int)(char)bVar1);
          if (uVar12 < uVar8 - 1) {
            pRes = p->puTemp2;
            nVars = p->nVars;
            lVar9 = (ulong)uVar8 - 1;
            do {
              bVar2 = abStack_48[lVar9];
              Kit_TruthExistNew(pRes,pIsf->puOff,nVars,(int)(char)bVar2);
              nVars = p->nVars;
              pRes = p->puTemp2;
              uVar11 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
              if (nVars < 6) {
                uVar11 = 1;
              }
              do {
                if ((int)uVar11 < 1) {
                  pIsfL->uUniq = 1 << (bVar1 & 0x1f);
                  pIsfR->uUniq = 1 << (bVar2 & 0x1f);
                  return 1;
                }
                lVar5 = uVar11 - 1;
                lVar6 = uVar11 - 1;
                lVar7 = uVar11 - 1;
                uVar11 = uVar11 - 1;
              } while ((pRes[lVar7] & p->puTemp1[lVar5] & pIsf->puOn[lVar6]) == 0);
              lVar9 = lVar9 + -1;
            } while ((long)uVar12 < lVar9);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar8);
        return 0;
      }
    }
    return 0;
  }
  __assert_fail("pIsfR->uSupp == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                ,0xd6,
                "int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
               );
}

Assistant:

int Bdc_DecomposeFindInitialVarSet( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    char pVars[16];
    int v, nVars, Beg, End;

    assert( pIsfL->uSupp == 0 );
    assert( pIsfR->uSupp == 0 );

    // fill in the variables
    nVars = 0;
    for ( v = 0; v < p->nVars; v++ )
        if ( pIsf->uSupp & (1 << v) )
            pVars[nVars++] = v;

    // try variable pairs
    for ( Beg = 0; Beg < nVars; Beg++ )
    {
        Kit_TruthExistNew( p->puTemp1, pIsf->puOff, p->nVars, pVars[Beg] ); 
        for ( End = nVars - 1; End > Beg; End-- )
        {
            Kit_TruthExistNew( p->puTemp2, pIsf->puOff, p->nVars, pVars[End] ); 
            if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp1, p->puTemp2, p->nVars) )
            {
                pIsfL->uUniq = (1 << pVars[Beg]);
                pIsfR->uUniq = (1 << pVars[End]);
                return 1;
            }
        }
    }
    return 0;
}